

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall
bidirectional::BiDirectional::updateEfficientLabels
          (BiDirectional *this,Directions *direction,Label *candidate_label)

{
  bool bVar1;
  Search *efficient_labels_ptr;
  BiDirectional *label;
  iterator candidate_label_00;
  iterator this_00;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  _Var2;
  iterator direction_00;
  size_type sVar3;
  Search *in_RDX;
  BiDirectional *in_RSI;
  __normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
  in_RDI;
  bool dominated;
  vector<labelling::Label,_std::allocator<labelling::Label>_> *efficient_labels_vertex;
  int *lemon_id;
  Search *search_ptr;
  Label *in_stack_ffffffffffffff88;
  Search *in_stack_ffffffffffffff90;
  BiDirectional *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  BiDirectional *this_01;
  Label *label_00;
  
  efficient_labels_ptr =
       getSearchPtr(in_stack_ffffffffffffff98,(Directions)((ulong)in_stack_ffffffffffffff90 >> 0x20)
                   );
  label_00 = (Label *)&in_RDX->unprocessed_count;
  label = (BiDirectional *)
          std::
          vector<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
          ::operator[](&efficient_labels_ptr->efficient_labels,(long)*(int *)label_00);
  candidate_label_00 =
       std::vector<labelling::Label,_std::allocator<labelling::Label>_>::begin
                 (in_stack_ffffffffffffff88);
  this_00 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::end
                      (in_stack_ffffffffffffff88);
  _Var2._M_current._7_1_ = in_stack_ffffffffffffffaf;
  _Var2._M_current._0_7_ = in_stack_ffffffffffffffa8;
  _Var2 = std::
          find<__gnu_cxx::__normal_iterator<labelling::Label*,std::vector<labelling::Label,std::allocator<labelling::Label>>>,labelling::Label>
                    (_Var2,in_RDI,(Label *)in_stack_ffffffffffffff98);
  direction_00 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::end
                           (in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::
          operator==<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                    ((__normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                      *)in_stack_ffffffffffffff90,
                     (__normal_iterator<labelling::Label_*,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>
                      *)in_stack_ffffffffffffff88);
  if (bVar1) {
    efficient_labels_ptr->generated_count = efficient_labels_ptr->generated_count + 1;
    sVar3 = std::vector<labelling::Label,_std::allocator<labelling::Label>_>::size
                      ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)label);
    if (sVar3 < 2) {
      Search::pushEfficientLabel
                (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,(Label *)0x246cfe);
      Search::pushUnprocessedLabel(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      in_RSI = in_stack_ffffffffffffff98;
      this_01 = label;
    }
    else {
      this_01 = label;
      std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
      operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_> *)
                 0x246c82);
      bVar1 = labelling::runDominanceEff
                        ((vector<labelling::Label,_std::allocator<labelling::Label>_> *)
                         efficient_labels_ptr,label_00,(Directions *)this_01,
                         (bool *)_Var2._M_current);
      if ((!bVar1) &&
         (bVar1 = checkPrimalBound((BiDirectional *)this_00._M_current,
                                   (Directions *)direction_00._M_current,
                                   (Label *)CONCAT17(bVar1,in_stack_ffffffffffffffa8)), !bVar1)) {
        Search::pushEfficientLabel(in_RDX,(int *)label,(Label *)0x246cd5);
        Search::pushUnprocessedLabel(in_RDX,(Label *)label);
      }
    }
    updateBestLabels(this_01,(Directions *)_Var2._M_current,candidate_label_00._M_current);
    Search::addVisitedVertex((Search *)in_RDI._M_current,(int *)in_RSI);
  }
  return;
}

Assistant:

void BiDirectional::updateEfficientLabels(
    const Directions&       direction,
    const labelling::Label& candidate_label) {
  Search* search_ptr = getSearchPtr(direction);
  // const ref vertex index
  const int& lemon_id = candidate_label.vertex.lemon_id;
  // ref efficient_labels_ for a given vertex
  std::vector<labelling::Label>& efficient_labels_vertex =
      search_ptr->efficient_labels[lemon_id];

  if (std::find(
          efficient_labels_vertex.begin(),
          efficient_labels_vertex.end(),
          candidate_label) == efficient_labels_vertex.end()) {
    ++search_ptr->generated_count;
    // If there already exists labels for the given vertex
    if (efficient_labels_vertex.size() > 1) {
      // check if new_label is dominated by any other comparable label
      const bool dominated = runDominanceEff(
          &efficient_labels_vertex,
          candidate_label,
          direction,
          params_ptr_->elementary);
      if (!dominated && !checkPrimalBound(direction, candidate_label)) {
        // add candidate_label to efficient_labels and unprocessed heap
        search_ptr->pushEfficientLabel(lemon_id, candidate_label);
        search_ptr->pushUnprocessedLabel(candidate_label);
        SPDLOG_DEBUG("\t Added to the queue.");
      } else {
        SPDLOG_DEBUG("\t Label dominated.");
      }
    } else {
      // First label produced for the vertex
      // update both efficient and unprocessed labels
      search_ptr->pushEfficientLabel(lemon_id, candidate_label);
      search_ptr->pushUnprocessedLabel(candidate_label);
      SPDLOG_DEBUG("\t Added to the queue (no other label at this vertex).");
    }
    updateBestLabels(direction, candidate_label);
    // Update vertices visited
    search_ptr->addVisitedVertex(lemon_id);
  }
}